

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::clearAccessChain(Builder *this)

{
  Builder *this_local;
  
  (this->accessChain).base = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&(this->accessChain).indexChain);
  (this->accessChain).instr = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&(this->accessChain).swizzle);
  (this->accessChain).component = 0;
  (this->accessChain).preSwizzleBaseType = 0;
  (this->accessChain).isRValue = false;
  AccessChain::CoherentFlags::clear(&(this->accessChain).coherentFlags);
  (this->accessChain).alignment = 0;
  return;
}

Assistant:

void Builder::clearAccessChain()
{
    accessChain.base = NoResult;
    accessChain.indexChain.clear();
    accessChain.instr = NoResult;
    accessChain.swizzle.clear();
    accessChain.component = NoResult;
    accessChain.preSwizzleBaseType = NoType;
    accessChain.isRValue = false;
    accessChain.coherentFlags.clear();
    accessChain.alignment = 0;
}